

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_p_race_stats(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"str");
    *(wchar_t *)((long)pvVar3 + 0x3c) = wVar1;
    wVar1 = parser_getint(p,"dex");
    *(wchar_t *)((long)pvVar3 + 0x48) = wVar1;
    wVar1 = parser_getint(p,"con");
    *(wchar_t *)((long)pvVar3 + 0x4c) = wVar1;
    wVar1 = parser_getint(p,"int");
    *(wchar_t *)((long)pvVar3 + 0x40) = wVar1;
    wVar1 = parser_getint(p,"wis");
    *(wchar_t *)((long)pvVar3 + 0x44) = wVar1;
    pVar2 = PARSE_ERROR_NONE;
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_p_race_stats(struct parser *p) {
	struct player_race *r = parser_priv(p);
	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	r->r_adj[STAT_STR] = parser_getint(p, "str");
	r->r_adj[STAT_DEX] = parser_getint(p, "dex");
	r->r_adj[STAT_CON] = parser_getint(p, "con");
	r->r_adj[STAT_INT] = parser_getint(p, "int");
	r->r_adj[STAT_WIS] = parser_getint(p, "wis");
	return PARSE_ERROR_NONE;
}